

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

bool __thiscall
Fossilize::ExternalReplayer::Impl::get_failed
          (Impl *this,
          vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          *failed,size_t *count,uint *indices,Hash *hashes)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  size_type sVar4;
  pair<unsigned_int,_unsigned_long> *mod;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  *__range2;
  Hash *hashes_local;
  uint *indices_local;
  size_t *count_local;
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  *failed_local;
  Impl *this_local;
  
  if (hashes == (Hash *)0x0) {
    sVar4 = std::
            vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            ::size(failed);
    *count = sVar4;
    this_local._7_1_ = true;
  }
  else {
    sVar4 = *count;
    sVar2 = std::
            vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            ::size(failed);
    if (sVar4 == sVar2) {
      __end2 = std::
               vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
               ::begin(failed);
      mod = (pair<unsigned_int,_unsigned_long> *)
            std::
            vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            ::end(failed);
      __range2 = (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                  *)hashes;
      hashes_local = (Hash *)indices;
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                                    *)&mod);
        if (!bVar1) break;
        ppVar3 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
                 ::operator*(&__end2);
        *(uint *)hashes_local = ppVar3->first;
        (__range2->
        super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar3->second;
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_int,_unsigned_long>_*,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
        ::operator++(&__end2);
        __range2 = (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    *)&(__range2->
                       super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
        hashes_local = (Hash *)((long)hashes_local + 4);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExternalReplayer::Impl::get_failed(const std::vector<std::pair<unsigned, Hash>> &failed,
                                        size_t *count, unsigned *indices, Hash *hashes) const
{
	if (hashes)
	{
		if (*count != failed.size())
			return false;

		for (auto &mod : failed)
		{
			*indices++ = mod.first;
			*hashes++ = mod.second;
		}
		return true;
	}
	else
	{
		*count = failed.size();
		return true;
	}
}